

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpTypeStruct
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  mapped_type *this_00;
  size_type sVar4;
  reference puVar5;
  Operand *__args;
  IRContext *this_01;
  iterator iStack_60;
  uint32_t idx;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  OperandList new_operands;
  mapped_type *live_members;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 == OpTypeStruct) {
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = opt::Instruction::result_id(inst);
    this_00 = std::
              unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->used_members_,
                           (key_type *)
                           ((long)&new_operands.
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                      (this_00);
    uVar3 = opt::Instruction::NumInOperands(inst);
    if (sVar4 == uVar3) {
      this_local._7_1_ = false;
    }
    else {
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &__range2);
      __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                         (this_00);
      iStack_60 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  end(this_00);
      while( true ) {
        bVar1 = std::operator!=(&__end2,&stack0xffffffffffffffa0);
        if (!bVar1) break;
        puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
        __args = opt::Instruction::GetInOperand(inst,*puVar5);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &__range2,__args);
        std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
      }
      opt::Instruction::SetInOperands(inst,(OperandList *)&__range2);
      this_01 = Pass::context((Pass *)this);
      IRContext::UpdateDefUse(this_01,inst);
      this_local._7_1_ = true;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &__range2);
    }
    return this_local._7_1_;
  }
  __assert_fail("inst->opcode() == spv::Op::OpTypeStruct",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x166,
                "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpTypeStruct(Instruction *)");
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpTypeStruct(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpTypeStruct);

  const auto& live_members = used_members_[inst->result_id()];
  if (live_members.size() == inst->NumInOperands()) {
    return false;
  }

  Instruction::OperandList new_operands;
  for (uint32_t idx : live_members) {
    new_operands.emplace_back(inst->GetInOperand(idx));
  }

  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}